

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.hpp
# Opt level: O2

void __thiscall Sega::MasterSystem::Machine::Options::Options(Options *this,OptionsType type)

{
  (this->super_DisplayOption<Sega::MasterSystem::Machine::Options>).output =
       (uint)(type != UserFriendly) * 2;
  (this->super_StructImpl<Sega::MasterSystem::Machine::Options>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00587498;
  if (Reflection::StructImpl<Sega::MasterSystem::Machine::Options>::contents__abi_cxx11_._M_h.
      _M_element_count != 0) {
    return;
  }
  Configurable::DisplayOption<Sega::MasterSystem::Machine::Options>::declare_display_option
            (&this->super_DisplayOption<Sega::MasterSystem::Machine::Options>);
  return;
}

Assistant:

Options(Configurable::OptionsType type) :
					Configurable::DisplayOption<Options>(type == Configurable::OptionsType::UserFriendly ? Configurable::Display::RGB : Configurable::Display::CompositeColour) {
					if(needs_declare()) {
						declare_display_option();
					}
				}